

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * QLocale::languageToString(QString *__return_storage_ptr__,Language language)

{
  char *pcVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QByteArrayView ba;
  char *local_30;
  QByteArrayView local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (language < (LastLanguage|C)) {
    pcVar1 = "Default" + language_name_index[language];
    local_30 = pcVar1;
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_28,&local_30);
    ba.m_data = pcVar1;
    ba.m_size = (qsizetype)local_28.m_data;
    QString::fromUtf8(__return_storage_ptr__,(QString *)local_28.m_size,ba);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_002d9f46;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_002d9f46:
      __stack_chk_fail();
    }
    latin1.m_data = "Unknown";
    latin1.m_size = 7;
    QString::QString(__return_storage_ptr__,latin1);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::languageToString(Language language)
{
    if (language > LastLanguage)
        return "Unknown"_L1;
    return QString::fromUtf8(language_name_list + language_name_index[language]);
}